

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshBuffer.h
# Opt level: O0

void __thiscall
irr::scene::CMeshBuffer<irr::video::S3DVertex2TCoords>::recalculateBoundingBox
          (CMeshBuffer<irr::video::S3DVertex2TCoords> *this)

{
  bool bVar1;
  u32 uVar2;
  array<irr::video::S3DVertex2TCoords> *this_00;
  S3DVertex2TCoords *initValue;
  vector3d<float> *p;
  long in_RDI;
  u32 i;
  u32 vsize;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  float z;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar3;
  undefined4 in_stack_fffffffffffffff4;
  
  z = (float)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  uVar2 = (u32)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  bVar1 = core::array<irr::video::S3DVertex2TCoords>::empty
                    ((array<irr::video::S3DVertex2TCoords> *)0x2f790f);
  if (bVar1) {
    core::aabbox3d<float>::reset
              ((aabbox3d<float> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               (float)((ulong)in_RDI >> 0x20),(float)in_RDI,z);
  }
  else {
    this_00 = (array<irr::video::S3DVertex2TCoords> *)(in_RDI + 0x118);
    initValue = core::array<irr::video::S3DVertex2TCoords>::operator[](this_00,uVar2);
    core::aabbox3d<float>::reset((aabbox3d<float> *)this_00,(vector3d<float> *)initValue);
    uVar2 = core::array<irr::video::S3DVertex2TCoords>::size
                      ((array<irr::video::S3DVertex2TCoords> *)0x2f7956);
    for (uVar3 = 1; uVar3 < uVar2; uVar3 = uVar3 + 1) {
      p = (vector3d<float> *)(in_RDI + 0x118);
      core::array<irr::video::S3DVertex2TCoords>::operator[](this_00,(u32)((ulong)p >> 0x20));
      core::aabbox3d<float>::addInternalPoint((aabbox3d<float> *)this_00,p);
    }
  }
  return;
}

Assistant:

void recalculateBoundingBox() override
	{
		if (!Vertices.empty()) {
			BoundingBox.reset(Vertices[0].Pos);
			const irr::u32 vsize = Vertices.size();
			for (u32 i = 1; i < vsize; ++i)
				BoundingBox.addInternalPoint(Vertices[i].Pos);
		} else
			BoundingBox.reset(0, 0, 0);
	}